

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O2

lookahead_entry * pop(lookahead_ctx *ctx,int *idx)

{
  int iVar1;
  lookahead_entry *plVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = *idx;
  iVar3 = iVar1 + 1;
  iVar4 = 0;
  if (ctx->max_sz <= iVar3) {
    iVar4 = ctx->max_sz;
  }
  plVar2 = ctx->buf;
  *idx = iVar3 - iVar4;
  return plVar2 + iVar1;
}

Assistant:

static struct lookahead_entry *pop(struct lookahead_ctx *ctx, int *idx) {
  int index = *idx;
  struct lookahead_entry *buf = ctx->buf + index;

  assert(index < ctx->max_sz);
  if (++index >= ctx->max_sz) index -= ctx->max_sz;
  *idx = index;
  return buf;
}